

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_bool_optional_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar4 = id * 2 + 4;
  if ((uVar4 < (uint)td->vsize) &&
     (uVar5 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar4), uVar5 != 0)) {
    cVar1 = *(char *)((long)td->table + uVar5);
    iVar2 = td->count;
    td->count = iVar2 + 1;
    if (iVar2 != 0) {
      pcVar3 = ctx->p;
      ctx->p = pcVar3 + 1;
      *pcVar3 = ',';
    }
    print_name(ctx,name,len);
    if (cVar1 == '\0') {
      builtin_strncpy(ctx->p,"false",6);
      lVar6 = 5;
    }
    else {
      builtin_strncpy(ctx->p,"true",5);
      lVar6 = 4;
    }
    ctx->p = ctx->p + lVar6;
  }
  return;
}

Assistant:

static inline const void *get_field_ptr(flatcc_json_printer_table_descriptor_t *td, int id)
{
    uoffset_t vo = (uoffset_t)(id + 2) * (uoffset_t)sizeof(voffset_t);

    if (vo >= (uoffset_t)td->vsize) {
        return 0;
    }
    vo = read_voffset(td->vtable, vo);
    if (vo == 0) {
        return 0;
    }
    return (uint8_t *)td->table + vo;
}